

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

void slang::getMacroArgExpansions
               (SourceManager *sm,SourceLocation loc,bool isStart,
               SmallVectorBase<slang::BufferID> *results)

{
  SmallVectorBase<slang::BufferID> *this;
  bool bVar1;
  SourceLocation local_70;
  undefined1 local_60 [8];
  SourceRange range;
  BufferID local_3c;
  SourceManager *local_38;
  SourceManager *local_30;
  SmallVectorBase<slang::BufferID> *local_28;
  SmallVectorBase<slang::BufferID> *results_local;
  SourceManager *pSStack_18;
  bool isStart_local;
  SourceManager *sm_local;
  SourceLocation loc_local;
  
  local_28 = results;
  results_local._7_1_ = isStart;
  pSStack_18 = sm;
  sm_local = (SourceManager *)loc;
  while( true ) {
    local_30 = sm_local;
    bVar1 = SourceManager::isMacroLoc(pSStack_18,(SourceLocation)sm_local);
    if (!bVar1) break;
    local_38 = sm_local;
    bVar1 = SourceManager::isMacroArgLoc(pSStack_18,(SourceLocation)sm_local);
    this = local_28;
    if (bVar1) {
      local_3c = SourceLocation::buffer((SourceLocation *)&sm_local);
      SmallVectorBase<slang::BufferID>::push_back(this,&local_3c);
      range.endLoc = (SourceLocation)sm_local;
      sm_local = (SourceManager *)SourceManager::getOriginalLoc(pSStack_18,(SourceLocation)sm_local)
      ;
    }
    else {
      _local_60 = SourceManager::getExpansionRange(pSStack_18,(SourceLocation)sm_local);
      if ((results_local._7_1_ & 1) == 0) {
        local_70 = SourceRange::end((SourceRange *)local_60);
      }
      else {
        local_70 = SourceRange::start((SourceRange *)local_60);
      }
      sm_local = (SourceManager *)local_70;
    }
  }
  return;
}

Assistant:

static void getMacroArgExpansions(const SourceManager& sm, SourceLocation loc, bool isStart,
                                  SmallVectorBase<BufferID>& results) {
    while (sm.isMacroLoc(loc)) {
        if (sm.isMacroArgLoc(loc)) {
            results.push_back(loc.buffer());
            loc = sm.getOriginalLoc(loc);
        }
        else {
            auto range = sm.getExpansionRange(loc);
            loc = isStart ? range.start() : range.end();
        }
    }
}